

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  Token *local_18;
  Token *this_local;
  
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  bVar1 = IsTokenTypeBare(this->token_type_);
  if (bVar1) {
    pcVar2 = GetTokenTypeName(this->token_type_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = HasLiteral(this);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&(this->field_2).literal_.text,&local_1a);
      std::allocator<char>::~allocator(&local_1a);
    }
    else {
      bVar1 = HasOpcode(this);
      if (bVar1) {
        pcVar2 = Opcode::GetName(&(this->field_2).opcode_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar2,&local_1b);
        std::allocator<char>::~allocator(&local_1b);
      }
      else {
        bVar1 = HasText(this);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)__return_storage_ptr__,&(this->field_2).text_,&local_1c);
          std::allocator<char>::~allocator(&local_1c);
        }
        else {
          bVar1 = IsTokenTypeRefKind(this->token_type_);
          if (bVar1) {
            pcVar2 = Type::GetRefKindName(&(this->field_2).type_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,pcVar2,&local_1d);
            std::allocator<char>::~allocator(&local_1d);
          }
          else {
            bVar1 = HasType(this);
            if (!bVar1) {
              __assert_fail("HasType()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/token.cc"
                            ,0x55,"std::string wabt::Token::to_string() const");
            }
            Type::GetName_abi_cxx11_(__return_storage_ptr__,&(this->field_2).type_);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return std::string(literal_.text);
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return std::string(text_);
  } else if (IsTokenTypeRefKind(token_type_)) {
    return type_.GetRefKindName();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}